

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_copy(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong nblimbs;
  
  if (X != Y) {
    if (Y->p == (mbedtls_mpi_uint *)0x0) {
      mbedtls_mpi_free(X);
    }
    else {
      uVar3 = Y->n + 1;
      do {
        if (uVar3 == 2) {
          nblimbs = 1;
          break;
        }
        nblimbs = uVar3 - 1;
        lVar1 = uVar3 - 2;
        uVar3 = nblimbs;
      } while (Y->p[lVar1] == 0);
      X->s = Y->s;
      if (X->n < nblimbs) {
        iVar2 = mbedtls_mpi_grow(X,nblimbs);
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      else {
        memset(X->p + nblimbs,0,(X->n - nblimbs) * 8);
      }
      memcpy(X->p,Y->p,nblimbs << 3);
    }
  }
  return 0;
}

Assistant:

int mbedtls_mpi_copy( mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    int ret = 0;
    size_t i;

    if( X == Y )
        return( 0 );

    if( Y->p == NULL )
    {
        mbedtls_mpi_free( X );
        return( 0 );
    }

    for( i = Y->n - 1; i > 0; i-- )
        if( Y->p[i] != 0 )
            break;
    i++;

    X->s = Y->s;

    if( X->n < i )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i ) );
    }
    else
    {
        memset( X->p + i, 0, ( X->n - i ) * ciL );
    }

    memcpy( X->p, Y->p, i * ciL );

cleanup:

    return( ret );
}